

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O0

void __thiscall
QNetworkRequestFactory::clearAttribute(QNetworkRequestFactory *this,Attribute attribute)

{
  bool bVar1;
  QNetworkRequestFactoryPrivate *pQVar2;
  QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *in_RDI;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *this_00;
  char local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::operator->
            ((QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *)0x3284ae);
  bVar1 = QHash<QNetworkRequest::Attribute,_QVariant>::contains
                    ((QHash<QNetworkRequest::Attribute,_QVariant> *)this_00,(Attribute *)in_RDI);
  if (bVar1) {
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach(in_RDI);
    pQVar2 = QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *)0x3284dc);
    QHash<QNetworkRequest::Attribute,_QVariant>::remove(&pQVar2->attributes,local_c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkRequestFactory::clearAttribute(QNetworkRequest::Attribute attribute)
{
    if (!d->attributes.contains(attribute))
        return;
    d.detach();
    d->attributes.remove(attribute);
}